

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O3

double __thiscall IntVar::getScore(IntVar *this,VarBranch vb)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  undefined8 *puVar6;
  int iVar7;
  undefined4 uVar8;
  Tchar *pTVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  IntVar *pIVar13;
  Tchar *pTVar14;
  long lVar15;
  longdouble in_ST0;
  double dVar16;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  TrailElem TStack_58;
  IntVar *pIStack_48;
  
  uVar11 = (ulong)(vb - VAR_SIZE_MIN);
  if (0xc < vb - VAR_SIZE_MIN) {
switchD_00136e5a_caseD_9:
    getScore();
    if ((((this->sbps_value_selection == true) &&
         (uVar5 = this->last_solution_value, (this->min).v <= (int)uVar5)) &&
        ((int)uVar5 <= (this->max).v)) &&
       ((this->vals == (Tchar *)0x0 || (this->vals[(int)uVar5].v != '\0')))) {
LAB_00137049:
      puVar6 = (undefined8 *)operator_new(0x10);
      dVar16 = extraout_XMM0_Qa_03;
      goto LAB_00137053;
    }
    pIVar13 = this;
    switch(this->preferred_val) {
    case PV_MIN:
      puVar6 = (undefined8 *)operator_new(0x10);
      uVar5 = (this->min).v;
      dVar16 = extraout_XMM0_Qa;
      break;
    case PV_MAX:
      puVar6 = (undefined8 *)operator_new(0x10);
      uVar5 = (this->max).v;
      dVar16 = extraout_XMM0_Qa_02;
      break;
    case PV_SPLIT_MIN:
      puVar6 = (undefined8 *)operator_new(0x10);
      uVar5 = (this->min).v;
      uVar5 = (int)(~uVar5 + (this->max).v) / 2 + uVar5;
      uVar8 = 3;
      dVar16 = extraout_XMM0_Qa_00;
      goto LAB_00137058;
    case PV_SPLIT_MAX:
      puVar6 = (undefined8 *)operator_new(0x10);
      iVar7 = (this->min).v;
      uVar5 = ((this->max).v - iVar7) / 2 + iVar7;
      uVar8 = 2;
      dVar16 = extraout_XMM0_Qa_01;
      goto LAB_00137058;
    case PV_MEDIAN:
      pTVar9 = this->vals;
      if (pTVar9 == (Tchar *)0x0) {
        branch();
        goto switchD_00136f54_default;
      }
      uVar5 = (this->min).v;
      uVar1 = (this->max).v;
      if ((uVar5 != uVar1) && ((int)((long)(int)uVar5 + 1) < (int)uVar1)) {
        iVar7 = 2;
        lVar15 = 0;
        do {
          iVar7 = iVar7 + pTVar9[lVar15 + (long)(int)uVar5 + 1].v;
          lVar15 = lVar15 + 1;
        } while (~uVar5 + uVar1 != (int)lVar15);
        if (2 < iVar7) {
          uVar12 = 0;
          do {
            uVar4 = 0x80000000;
            if (uVar5 != uVar1) {
              pTVar14 = pTVar9 + (long)(int)uVar5 + 1;
              do {
                uVar5 = uVar5 + 1;
                pcVar3 = &pTVar14->v;
                pTVar14 = pTVar14 + 1;
                uVar4 = uVar5;
              } while (*pcVar3 == '\0');
            }
            uVar5 = uVar4;
            uVar12 = uVar12 + 1;
          } while (uVar12 != iVar7 - 1U >> 1);
        }
      }
      goto LAB_00137049;
    default:
switchD_00136f54_default:
      branch();
      dVar16 = extraout_XMM0_Qa_04;
      if ((long)uVar11 <= (long)(pIVar13->max).v) {
        TStack_58.x = (pIVar13->min).v;
        TStack_58.sz = 4;
        TStack_58.pt = &(pIVar13->min).v;
        pIStack_48 = this;
        vec<TrailElem>::push(&engine.trail,&TStack_58);
        iVar7 = (int)uVar11;
        (pIVar13->min).v = iVar7;
        uVar5 = pIVar13->changes | 3;
        pIVar13->changes = uVar5;
        pTVar9 = pIVar13->vals;
        dVar16 = extraout_XMM0_Qa_05;
        if ((pTVar9 != (Tchar *)0x0) && (pTVar9[iVar7].v == '\0')) {
          iVar10 = iVar7 + -1;
          pTVar9 = pTVar9 + iVar7;
          do {
            iVar10 = iVar10 + 1;
            pcVar3 = &pTVar9->v;
            pTVar9 = pTVar9 + 1;
          } while (*pcVar3 == '\0');
          TStack_58.sz = 4;
          TStack_58.pt = &(pIVar13->min).v;
          TStack_58.x = iVar7;
          vec<TrailElem>::push(&engine.trail,&TStack_58);
          (pIVar13->min).v = iVar10;
          uVar5 = pIVar13->changes | 3;
          pIVar13->changes = uVar5;
          iVar7 = iVar10;
          dVar16 = extraout_XMM0_Qa_06;
        }
        if (iVar7 == (pIVar13->max).v) {
          pIVar13->changes = uVar5 | 8;
        }
        if (pIVar13->in_queue == false) {
          pIVar13->in_queue = true;
          TStack_58.pt = (int *)pIVar13;
          vec<IntVar_*>::push(&engine.v_queue,(IntVar **)&TStack_58);
          dVar16 = extraout_XMM0_Qa_07;
        }
      }
      return dVar16;
    }
LAB_00137053:
    uVar8 = 1;
LAB_00137058:
    *puVar6 = this;
    *(uint *)(puVar6 + 1) = uVar5;
    *(undefined4 *)((long)puVar6 + 0xc) = uVar8;
    return dVar16;
  }
  switch(uVar11) {
  case 0:
    iVar7 = (this->min).v;
    goto LAB_00136eb7;
  case 1:
    iVar7 = (this->max).v;
    goto LAB_00136edb;
  case 2:
    iVar7 = 0;
LAB_00136edb:
    iVar7 = iVar7 - (this->min).v;
    goto LAB_00136ede;
  case 3:
    dVar16 = (double)(this->min).v;
    break;
  case 4:
    iVar7 = 0;
LAB_00136eb7:
    iVar7 = iVar7 - (this->max).v;
LAB_00136ede:
    dVar16 = (double)iVar7;
    break;
  case 5:
    dVar16 = (double)(this->max).v;
    break;
  case 6:
    dVar16 = (double)((ulong)(double)(this->pinfo).sz | (ulong)DAT_001d7cf0);
    break;
  case 7:
    dVar16 = (double)(this->pinfo).sz;
    break;
  case 8:
    iVar7 = (this->min).v;
    dVar16 = 0.0;
    if (iVar7 != (this->max).v) {
      if (this->vals == (Tchar *)0x0) {
        dVar16 = 1.0;
      }
      else {
        lVar15 = 0;
        do {
          lVar2 = lVar15 + (long)iVar7 + 1;
          lVar15 = lVar15 + 1;
        } while (this->vals[lVar2].v == '\0');
        dVar16 = (double)(int)lVar15;
      }
    }
    break;
  default:
    goto switchD_00136e5a_caseD_9;
  case 10:
    MIP::getRC((longdouble *)mip,(MIP *)this,
               (IntVar *)
               ((long)&switchD_00136e5a::switchdataD_001d7d00 +
               (long)(int)(&switchD_00136e5a::switchdataD_001d7d00)[uVar11]));
    dVar16 = (double)in_ST0;
    break;
  case 0xc:
    dVar16 = this->activity;
  }
  return dVar16;
}

Assistant:

double IntVar::getScore(VarBranch vb) {
	switch (vb) {
		case VAR_MIN_MIN:
			return -min;
		case VAR_MIN_MAX:
			return min;
		case VAR_MAX_MIN:
			return -max;
		case VAR_MAX_MAX:
			return max;
#if INT_BRANCH_HOLES
		// note slight inconsistency, if INT_BRANCH_HOLES=0 then we
		// use the domain size-1, same behaviour but more efficient?
		case VAR_SIZE_MIN:
			return vals ? -size() : min - (max + 1);
		case VAR_SIZE_MAX:
			return vals ? size() : max + 1 - min;
#else
		case VAR_SIZE_MIN:
			return min - max;
		case VAR_SIZE_MAX:
			return max - min;
#endif
		case VAR_DEGREE_MIN:
			return -static_cast<double>(pinfo.size());
		case VAR_DEGREE_MAX:
			return pinfo.size();
		case VAR_REDUCED_COST:
			return mip->getRC(this);
		case VAR_ACTIVITY:
			return activity;
		case VAR_REGRET_MIN_MAX:
			return isFixed() ? 0 : (vals != nullptr ? *++begin() - *begin() : 1);
#ifdef HAS_VAR_IMPACT
		case VAR_IMPACT:
			return isFixed() ? 0 : impact;
#endif

		default:
			NOT_SUPPORTED;
	}
}